

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall TypeTest_TestSubtypeErrors_Test::TestBody(TypeTest_TestSubtypeErrors_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 uVar2;
  undefined8 uVar3;
  char *in_R9;
  pointer *__ptr;
  _Array_type *__vtable;
  Signature SVar4;
  Array AVar5;
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  Type local_98;
  Type local_90;
  undefined1 local_88 [32];
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> local_68;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Stack_60;
  pointer local_58;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Stack_48;
  TypeBuilder builder;
  pointer local_38;
  AssertHelper local_30;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  TypeBuilder builder_3;
  
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&stack0xffffffffffffffb8,2);
  ::wasm::TypeBuilder::setHeapType((ulong)&stack0xffffffffffffffb8,(Signature)ZEXT816(0));
  SVar4.results.id = 0x22;
  SVar4.params.id = 1;
  ::wasm::TypeBuilder::setHeapType((ulong)&stack0xffffffffffffffb8,SVar4);
  uVar3 = ::wasm::TypeBuilder::getTempHeapType((ulong)&stack0xffffffffffffffb8);
  ::wasm::TypeBuilder::setSubType(&stack0xffffffffffffffb8,1,uVar3,1);
  ::wasm::TypeBuilder::build();
  local_68._M_head_impl._0_1_ = (internal)(local_88[0x18] != '\0');
  _Stack_60._M_head_impl = (Impl *)0x0;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_88._24_8_ & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&local_28,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)local_88);
  if (local_68._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&local_68,(AssertionResult *)"builder.build()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x5a0,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_60._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_60._M_head_impl);
  }
  ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&stack0xffffffffffffffb8);
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&stack0xffffffffffffffb8,2);
  local_88._0_8_ = 0x22;
  local_88._8_8_ = 0x22;
  ::wasm::Type::Type(&local_98,local_88,2);
  ::wasm::TypeBuilder::setHeapType((ulong)&stack0xffffffffffffffb8,(Signature)ZEXT816(0));
  local_88._0_8_ = (char *)0x22;
  local_88._8_8_ = 0x22;
  local_88._16_8_ = 0x22;
  ::wasm::Type::Type(&local_90,local_88,3);
  ::wasm::TypeBuilder::setHeapType((ulong)&stack0xffffffffffffffb8,(Signature)ZEXT816(1));
  uVar3 = ::wasm::TypeBuilder::getTempHeapType((ulong)&stack0xffffffffffffffb8);
  ::wasm::TypeBuilder::setSubType(&stack0xffffffffffffffb8,1,uVar3,1);
  ::wasm::TypeBuilder::build();
  local_68._M_head_impl._0_1_ = (internal)(local_88[0x18] != '\0');
  _Stack_60._M_head_impl = (Impl *)0x0;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_88._24_8_ & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&local_28,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)local_88);
  if (local_68._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&local_68,(AssertionResult *)"builder.build()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x5a9,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_60._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_60._M_head_impl);
  }
  ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&stack0xffffffffffffffb8);
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&stack0xffffffffffffffb8,2);
  local_88._0_8_ = 0x22;
  local_88._8_8_ = 0x100000000;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_88;
  ::wasm::TypeBuilder::setHeapType((ulong)&stack0xffffffffffffffb8,(Array)(auVar1 << 0x40));
  local_88._0_8_ = &DAT_0000002a;
  local_88._8_8_ = 0x100000000;
  AVar5.element._8_8_ = local_88;
  AVar5.element.type.id = 1;
  ::wasm::TypeBuilder::setHeapType((ulong)&stack0xffffffffffffffb8,AVar5);
  uVar3 = ::wasm::TypeBuilder::getTempHeapType((ulong)&stack0xffffffffffffffb8);
  ::wasm::TypeBuilder::setSubType(&stack0xffffffffffffffb8,1,uVar3);
  ::wasm::TypeBuilder::build();
  local_68._M_head_impl._0_1_ = (internal)(local_88[0x18] != '\0');
  _Stack_60._M_head_impl = (Impl *)0x0;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_88._24_8_ & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&local_28,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)local_88);
  if (local_68._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&local_68,(AssertionResult *)"builder.build()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x5b2,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_60._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_60._M_head_impl);
  }
  ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&stack0xffffffffffffffb8);
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_28,2);
  local_88._0_8_ = 0x22;
  local_88._8_8_ = 0;
  local_88._16_8_ = 0x22;
  local_88._24_8_ = 0;
  __l._M_len = 2;
  __l._M_array = (iterator)local_88;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xffffffffffffffb8,__l,
             (allocator_type *)&local_30);
  local_68._M_head_impl = _Stack_48._M_head_impl;
  _Stack_60._M_head_impl =
       (Impl *)builder.impl._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  local_58 = local_38;
  _Stack_48._M_head_impl = (Impl *)0x0;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )0x0;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x0);
  if (local_68._M_head_impl != (Impl *)0x0) {
    operator_delete(local_68._M_head_impl,(long)local_58 - (long)local_68._M_head_impl);
  }
  if (_Stack_48._M_head_impl != (Impl *)0x0) {
    operator_delete(_Stack_48._M_head_impl,-(long)_Stack_48._M_head_impl);
  }
  local_88._0_8_ = (char *)0x12;
  local_88._8_8_ = 0;
  local_88._16_8_ = 0x22;
  local_88._24_8_ = 0;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_88;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xffffffffffffffb8,__l_00,
             (allocator_type *)&local_30);
  local_68._M_head_impl = _Stack_48._M_head_impl;
  _Stack_60._M_head_impl =
       (Impl *)builder.impl._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  local_58 = (pointer)0x0;
  _Stack_48._M_head_impl = (Impl *)0x0;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )0x0;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x1);
  if (local_68._M_head_impl != (Impl *)0x0) {
    operator_delete(local_68._M_head_impl,(long)local_58 - (long)local_68._M_head_impl);
  }
  if (_Stack_48._M_head_impl != (Impl *)0x0) {
    operator_delete(_Stack_48._M_head_impl,-(long)_Stack_48._M_head_impl);
  }
  uVar3 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_28);
  ::wasm::TypeBuilder::setSubType(&local_28,1,uVar3,1);
  ::wasm::TypeBuilder::build();
  uVar2 = local_88[0x18];
  local_68._M_head_impl._0_1_ = (internal)(local_88[0x18] != '\0');
  _Stack_60._M_head_impl = (Impl *)0x0;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_88._24_8_ & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&stack0xffffffffffffffb8,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)local_88);
  if (uVar2 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffb8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&local_68,(AssertionResult *)"builder.build()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x5bb,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&stack0xffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if (_Stack_48._M_head_impl != (Impl *)0x0) {
      (**(code **)(*(long *)_Stack_48._M_head_impl + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_60._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_60._M_head_impl);
    }
  }
  ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_28);
  return;
}

Assistant:

TEST_F(TypeTest, TestSubtypeErrors) {
  Type anyref = Type(HeapType::any, Nullable);
  Type eqref = Type(HeapType::eq, Nullable);
  Type funcref = Type(HeapType::func, Nullable);

  {
    // Incompatible signatures.
    TypeBuilder builder(2);
    builder[0] = Signature(Type::none, anyref);
    builder[1] = Signature(anyref, Type::none);
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Signatures incompatible in tuple size.
    TypeBuilder builder(2);
    builder[0] = Signature(Type::none, {anyref, anyref});
    builder[1] = Signature(Type::none, {anyref, anyref, anyref});
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Mutable array fields are invariant.
    TypeBuilder builder(2);
    builder[0] = Array(Field(anyref, Mutable));
    builder[1] = Array(Field(eqref, Mutable));
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Incompatible struct prefixes
    TypeBuilder builder(2);
    builder[0] = Struct({Field(anyref, Immutable), Field(anyref, Immutable)});
    builder[1] = Struct({Field(funcref, Immutable), Field(anyref, Immutable)});
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }
}